

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O2

void __thiscall ChatWindow::loginFailed(ChatWindow *this,QString *reason)

{
  QArrayDataPointer<char16_t> local_30;
  
  tr((QString *)&local_30,"Error",(char *)0x0,-1);
  QMessageBox::critical(this,&local_30,reason,0x400,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  connectedToServer(this);
  return;
}

Assistant:

void ChatWindow::loginFailed(const QString &reason)
{
    // the server rejected the login attempt
    // display the reason for the rejection in a message box
    QMessageBox::critical(this, tr("Error"), reason);
    // allow the user to retry, execute the same slot as when just connected
    connectedToServer();
}